

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

CustomExternalWrapperObject *
Js::CustomExternalWrapperObject::Create
          (void *data,uint inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsGetterSetterInterceptor **getterSetterInterceptor,
          RecyclableObject *prototype,ScriptContext *scriptContext)

{
  Type interceptors;
  bool bVar1;
  CustomExternalWrapperType *this;
  undefined4 *puVar2;
  Recycler *pRVar3;
  CustomExternalWrapperObject *this_00;
  code *pcVar4;
  undefined1 local_78 [8];
  TrackAllocData data_1;
  
  if (prototype == (RecyclableObject *)0x0) {
    prototype = &JavascriptLibraryBase::GetObjectPrototype
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             super_JavascriptLibraryBase)->super_RecyclableObject;
  }
  this = (CustomExternalWrapperType *)
         JavascriptLibrary::GetCachedCustomExternalWrapperType
                   ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                    (uintptr_t)traceCallback,(uintptr_t)finalizeCallback,
                    (uintptr_t)*getterSetterInterceptor,(uintptr_t)prototype);
  data_1._32_8_ = traceCallback;
  if (this == (CustomExternalWrapperType *)0x0) {
    local_78 = (undefined1  [8])&CustomExternalWrapperType::typeinfo;
    data_1.typeinfo = (type_info *)0x0;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_6088375;
    data_1.filename._0_4_ = 0x4f;
    pRVar3 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
    this = (CustomExternalWrapperType *)new<Memory::Recycler>(0x50,pRVar3,0x37a1d4);
    CustomExternalWrapperType::CustomExternalWrapperType
              (this,scriptContext,traceCallback,finalizeCallback,prototype);
    interceptors = this->jsGetterSetterInterceptor;
    *getterSetterInterceptor = interceptors;
    JavascriptLibrary::CacheCustomExternalWrapperType
              ((scriptContext->super_ScriptContextBase).javascriptLibrary,(uintptr_t)traceCallback,
               (uintptr_t)finalizeCallback,(uintptr_t)interceptors,(uintptr_t)prototype,
               (DynamicType *)this);
  }
  else if (*getterSetterInterceptor == (JsGetterSetterInterceptor *)0x0) {
    *getterSetterInterceptor = this->jsGetterSetterInterceptor;
  }
  else if (*getterSetterInterceptor != this->jsGetterSetterInterceptor) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar2 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x5b,
                                "(*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor())"
                                ,
                                "*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor()"
                               );
    if (!bVar1) goto LAB_00a0dd11;
    *puVar2 = 0;
  }
  if (((this->super_DynamicType).super_Type.flags & TypeFlagMask_JsrtExternal) == TypeFlagMask_None)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar2 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x5f,"(dynamicType->IsJsrtExternal())",
                                "dynamicType->IsJsrtExternal()");
    if (!bVar1) {
LAB_00a0dd11:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  data_1.typeinfo = (type_info *)(ulong)inlineSlotSize;
  if (data_1._32_8_ == 0) {
    if (finalizeCallback == (JsFinalizeCallback)0x0) {
      local_78 = (undefined1  [8])&typeinfo;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_6088375;
      data_1.filename._0_4_ = 0x6c;
      pRVar3 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
      pcVar4 = Memory::Recycler::Alloc;
    }
    else {
      local_78 = (undefined1  [8])&typeinfo;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_6088375;
      data_1.filename._0_4_ = 0x68;
      pRVar3 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
      pcVar4 = Memory::Recycler::AllocFinalized;
    }
  }
  else {
    local_78 = (undefined1  [8])&typeinfo;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_6088375;
    data_1.filename._0_4_ = 100;
    pRVar3 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
    pcVar4 = Memory::Recycler::AllocTracked;
  }
  this_00 = (CustomExternalWrapperObject *)
            new<Memory::Recycler>(0x30,pRVar3,(offset_in_Recycler_to_subr)pcVar4,0);
  CustomExternalWrapperObject(this_00,this,data,inlineSlotSize);
  return this_00;
}

Assistant:

CustomExternalWrapperObject* CustomExternalWrapperObject::Create(void *data, uint inlineSlotSize, JsTraceCallback traceCallback, JsFinalizeCallback finalizeCallback, JsGetterSetterInterceptor ** getterSetterInterceptor, Js::RecyclableObject * prototype, Js::ScriptContext *scriptContext)
{
    if (prototype == nullptr)
    {
        prototype = scriptContext->GetLibrary()->GetObjectPrototype();
    }

    Js::DynamicType * dynamicType = scriptContext->GetLibrary()->GetCachedCustomExternalWrapperType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(*getterSetterInterceptor), reinterpret_cast<uintptr_t>(prototype));
    if (dynamicType == nullptr)
    {
        dynamicType = RecyclerNew(scriptContext->GetRecycler(), CustomExternalWrapperType, scriptContext, traceCallback, finalizeCallback, prototype);
        *getterSetterInterceptor = reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor();
        scriptContext->GetLibrary()->CacheCustomExternalWrapperType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(*getterSetterInterceptor), reinterpret_cast<uintptr_t>(prototype), dynamicType);
    }
    else
    {
        if (*getterSetterInterceptor == nullptr)
        {
            *getterSetterInterceptor = reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor();
        }
        else
        {
            Assert(*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor());
        }
    }

    Assert(dynamicType->IsJsrtExternal());

    CustomExternalWrapperObject * externalObject;
    if (traceCallback != nullptr)
    {
        externalObject = RecyclerNewTrackedPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }
    else if (finalizeCallback != nullptr)
    {
        externalObject = RecyclerNewFinalizedPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }
    else
    {
        externalObject = RecyclerNewPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }

    return externalObject;
}